

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_sh_miniscript_Test::TestBody(Descriptor_Parse_sh_miniscript_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  reference pvVar5;
  char *in_R9;
  AssertHelper local_1c58;
  Message local_1c50;
  DescriptorScriptReference local_1c48;
  Script local_18f8;
  string local_18c0;
  Script local_18a0;
  string local_1868;
  undefined1 local_1848 [8];
  AssertionResult gtest_ar_10;
  Message local_1830;
  DescriptorScriptType local_1824;
  DescriptorScriptReference local_1820;
  DescriptorScriptType local_14cc;
  undefined1 local_14c8 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_1498;
  Message local_1490;
  DescriptorScriptReference local_1488;
  bool local_1131;
  undefined1 local_1130 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1100;
  Message local_10f8;
  DescriptorScriptReference local_10f0;
  bool local_d99;
  undefined1 local_d98 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_d68;
  Message local_d60;
  DescriptorScriptReference local_d58;
  bool local_a01;
  undefined1 local_a00 [8];
  AssertionResult gtest_ar__2;
  Message local_9e8;
  Script local_9e0;
  string local_9a8;
  undefined1 local_988 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_958;
  Message local_950;
  bool local_941;
  undefined1 local_940 [8];
  AssertionResult gtest_ar__1;
  Message local_928;
  DescriptorScriptType local_920;
  DescriptorScriptType local_91c;
  undefined1 local_918 [8];
  AssertionResult gtest_ar_7;
  Message local_900;
  HashType local_8f8;
  HashType local_8f4;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_6;
  Message local_8d8;
  AddressType local_8d0;
  AddressType local_8cc;
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar_5;
  Message local_8b0;
  Address local_8a8;
  string local_730;
  undefined1 local_710 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_6e0;
  Message local_6d8;
  bool local_6c9;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_;
  Message local_6b0;
  int local_6a4;
  size_type local_6a0;
  undefined1 local_698 [8];
  AssertionResult gtest_ar_3;
  Message local_680;
  string local_678;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_2;
  Message local_640;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_1;
  Message local_620;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_618;
  AssertHelper local_600;
  Message local_5f8;
  Script local_5f0;
  AssertHelper local_5b8;
  Message local_5b0;
  string local_5a8;
  AssertHelper local_588;
  Message local_580 [2];
  Descriptor local_570;
  undefined1 local_408 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list1;
  AssertionResult gtest_ar;
  CfdException *except;
  undefined1 local_260 [8];
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_list;
  Script gen_script;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  undefined1 local_30 [8];
  string descriptor;
  Descriptor_Parse_sh_miniscript_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "sh(or_d(sha256(38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6),and_n(un:after(499999999),older(4194305))))"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,"",
             (allocator *)
             ((long)&gen_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gen_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script
            ((Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            *)local_260);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_30,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_408);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_570,(string *)local_30,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_570);
      cfd::core::Descriptor::~Descriptor(&local_570);
    }
  }
  else {
    testing::Message::Message(local_580);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2d2,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_588,local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message(local_580);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_5a8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_208,(string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5a8);
    }
  }
  else {
    testing::Message::Message(&local_5b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2d3,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
    testing::internal::AssertHelper::~AssertHelper(&local_5b8);
    testing::Message::~Message(&local_5b0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_5f0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_5f0);
      cfd::core::Script::~Script(&local_5f0);
    }
  }
  else {
    testing::Message::Message(&local_5f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2d4,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    testing::Message::~Message(&local_5f8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReferenceAll
                (&local_618,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::operator=((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   *)local_260,&local_618);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector(&local_618);
    }
  }
  else {
    testing::Message::Message(&local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2d5,
               "Expected: script_list = desc.GetReferenceAll(nullptr) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_620);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_638,"desc_str.c_str()","descriptor.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2d6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  cfd::core::Script::ToString_abi_cxx11_(&local_678,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_658,"locking_script.ToString().c_str()",
             "\"OP_HASH160 4abf8cfc94ae837bf59965e0c74d02a611ec1329 OP_EQUAL\"",pcVar2,
             "OP_HASH160 4abf8cfc94ae837bf59965e0c74d02a611ec1329 OP_EQUAL");
  std::__cxx11::string::~string((string *)&local_678);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(&local_680);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2d8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_680);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  local_6a0 = std::
              vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                      *)local_260);
  local_6a4 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_698,"script_list.size()","1",&local_6a0,&local_6a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
  if (!bVar1) {
    testing::Message::Message(&local_6b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_698);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
  sVar4 = std::
          vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
          ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_260);
  if (sVar4 == 1) {
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    local_6c9 = cfd::core::DescriptorScriptReference::HasAddress(pvVar5);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_6c8,&local_6c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c8);
    if (!bVar1) {
      testing::Message::Message(&local_6d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_4.message_,(internal *)local_6c8,
                 (AssertionResult *)"script_list[0].HasAddress()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2dc,pcVar2);
      testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_6d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c8);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GenerateAddress(&local_8a8,pvVar5,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_730,&local_8a8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_710,
               "script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"38WFPv9fne2UeFxVkGMhLkamMadH8j6s1c\"",pcVar2,"38WFPv9fne2UeFxVkGMhLkamMadH8j6s1c")
    ;
    std::__cxx11::string::~string((string *)&local_730);
    cfd::core::Address::~Address(&local_8a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
    if (!bVar1) {
      testing::Message::Message(&local_8b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_710);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2de,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_8b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_8b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    local_8cc = cfd::core::DescriptorScriptReference::GetAddressType(pvVar5);
    local_8d0 = kP2shAddress;
    testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
              ((EqHelper<false> *)local_8c8,"script_list[0].GetAddressType()",
               "AddressType::kP2shAddress",&local_8cc,&local_8d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c8);
    if (!bVar1) {
      testing::Message::Message(&local_8d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2df,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_8d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_8d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    local_8f4 = cfd::core::DescriptorScriptReference::GetHashType(pvVar5);
    local_8f8 = kP2sh;
    testing::internal::EqHelper<false>::Compare<cfd::core::HashType,cfd::core::HashType>
              ((EqHelper<false> *)local_8f0,"script_list[0].GetHashType()","HashType::kP2sh",
               &local_8f4,&local_8f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
    if (!bVar1) {
      testing::Message::Message(&local_900);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2e0,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_900);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_900);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    local_91c = cfd::core::DescriptorScriptReference::GetScriptType(pvVar5);
    local_920 = kDescriptorScriptSh;
    testing::internal::EqHelper<false>::
    Compare<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
              ((EqHelper<false> *)local_918,"script_list[0].GetScriptType()",
               "DescriptorScriptType::kDescriptorScriptSh",&local_91c,&local_920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_918);
    if (!bVar1) {
      testing::Message::Message(&local_928);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_918);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2e1,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_928);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_928);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_918);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    local_941 = cfd::core::DescriptorScriptReference::HasChild(pvVar5);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_940,&local_941,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
    if (!bVar1) {
      testing::Message::Message(&local_950);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_8.message_,(internal *)local_940,
                 (AssertionResult *)"script_list[0].HasChild()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_958,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2e3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_958,&local_950);
      testing::internal::AssertHelper::~AssertHelper(&local_958);
      std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_950);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetRedeemScript(&local_9e0,pvVar5);
    cfd::core::Script::ToString_abi_cxx11_(&local_9a8,&local_9e0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_988,"script_list[0].GetRedeemScript().ToString().c_str()",
               "\"OP_SIZE 32 OP_EQUALVERIFY OP_SHA256 38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6 OP_EQUAL OP_IFDUP OP_NOTIF OP_IF 499999999 OP_CHECKLOCKTIMEVERIFY OP_0NOTEQUAL OP_ELSE 0 OP_ENDIF OP_NOTIF 0 OP_ELSE 4194305 OP_CHECKSEQUENCEVERIFY OP_ENDIF OP_ENDIF\""
               ,pcVar2,
               "OP_SIZE 32 OP_EQUALVERIFY OP_SHA256 38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6 OP_EQUAL OP_IFDUP OP_NOTIF OP_IF 499999999 OP_CHECKLOCKTIMEVERIFY OP_0NOTEQUAL OP_ELSE 0 OP_ENDIF OP_NOTIF 0 OP_ELSE 4194305 OP_CHECKSEQUENCEVERIFY OP_ENDIF OP_ENDIF"
              );
    std::__cxx11::string::~string((string *)&local_9a8);
    cfd::core::Script::~Script(&local_9e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
    if (!bVar1) {
      testing::Message::Message(&local_9e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2e5,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_9e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_9e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_d58,pvVar5);
    bVar1 = cfd::core::DescriptorScriptReference::HasChild(&local_d58);
    local_a01 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_a00,&local_a01,(type *)0x0);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_d58);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
    if (!bVar1) {
      testing::Message::Message(&local_d60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3.message_,(internal *)local_a00,
                 (AssertionResult *)"script_list[0].GetChild().HasChild()","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_d68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2e6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d68,&local_d60);
      testing::internal::AssertHelper::~AssertHelper(&local_d68);
      std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
      testing::Message::~Message(&local_d60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_10f0,pvVar5);
    bVar1 = cfd::core::DescriptorScriptReference::HasKey(&local_10f0);
    local_d99 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_d98,&local_d99,(type *)0x0);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_10f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d98);
    if (!bVar1) {
      testing::Message::Message(&local_10f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__4.message_,(internal *)local_d98,
                 (AssertionResult *)"script_list[0].GetChild().HasKey()","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2e7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1100,&local_10f8);
      testing::internal::AssertHelper::~AssertHelper(&local_1100);
      std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_10f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d98);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_1488,pvVar5);
    bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript(&local_1488);
    local_1131 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1130,&local_1131,(type *)0x0);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1488);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1130);
    if (!bVar1) {
      testing::Message::Message(&local_1490);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_9.message_,(internal *)local_1130,
                 (AssertionResult *)"script_list[0].GetChild().HasRedeemScript()","true","false",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2e8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1498,&local_1490);
      testing::internal::AssertHelper::~AssertHelper(&local_1498);
      std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_1490);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1130);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_1820,pvVar5);
    local_14cc = cfd::core::DescriptorScriptReference::GetScriptType(&local_1820);
    local_1824 = kDescriptorScriptMiniscript;
    testing::internal::EqHelper<false>::
    Compare<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
              ((EqHelper<false> *)local_14c8,"script_list[0].GetChild().GetScriptType()",
               "DescriptorScriptType::kDescriptorScriptMiniscript",&local_14cc,&local_1824);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1820);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14c8);
    if (!bVar1) {
      testing::Message::Message(&local_1830);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_14c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2e9,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1830);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_1830);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_14c8);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetRedeemScript(&local_18a0,pvVar5);
    cfd::core::Script::ToString_abi_cxx11_(&local_1868,&local_18a0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_1c48,pvVar5);
    cfd::core::DescriptorScriptReference::GetLockingScript(&local_18f8,&local_1c48);
    cfd::core::Script::ToString_abi_cxx11_(&local_18c0,&local_18f8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1848,"script_list[0].GetRedeemScript().ToString().c_str()",
               "script_list[0].GetChild().GetLockingScript().ToString().c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_18c0);
    cfd::core::Script::~Script(&local_18f8);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1c48);
    std::__cxx11::string::~string((string *)&local_1868);
    cfd::core::Script::~Script(&local_18a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1848);
    if (!bVar1) {
      testing::Message::Message(&local_1c50);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1848);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x2eb,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1c58,&local_1c50);
      testing::internal::AssertHelper::~AssertHelper(&local_1c58);
      testing::Message::~Message(&local_1c50);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1848);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_408);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             *)local_260);
  cfd::core::Script::~Script
            ((Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_sh_miniscript) {
  // cfd::core::CfdCoreHandle handle = nullptr;
  // cfd::core::Initialize(&handle);
  std::string descriptor = "sh(or_d(sha256(38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6),and_n(un:after(499999999),older(4194305))))";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  Script gen_script;
  std::vector<DescriptorScriptReference> script_list;

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  std::vector<std::string> arg_list1;
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll(nullptr));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "OP_HASH160 4abf8cfc94ae837bf59965e0c74d02a611ec1329 OP_EQUAL");

  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_TRUE(script_list[0].HasAddress());
    EXPECT_STREQ(script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "38WFPv9fne2UeFxVkGMhLkamMadH8j6s1c");
    EXPECT_EQ(script_list[0].GetAddressType(), AddressType::kP2shAddress);
    EXPECT_EQ(script_list[0].GetHashType(), HashType::kP2sh);
    EXPECT_EQ(script_list[0].GetScriptType(), DescriptorScriptType::kDescriptorScriptSh);

    EXPECT_TRUE(script_list[0].HasChild());
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      "OP_SIZE 32 OP_EQUALVERIFY OP_SHA256 38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6 OP_EQUAL OP_IFDUP OP_NOTIF OP_IF 499999999 OP_CHECKLOCKTIMEVERIFY OP_0NOTEQUAL OP_ELSE 0 OP_ENDIF OP_NOTIF 0 OP_ELSE 4194305 OP_CHECKSEQUENCEVERIFY OP_ENDIF OP_ENDIF");
    EXPECT_FALSE(script_list[0].GetChild().HasChild());
    EXPECT_FALSE(script_list[0].GetChild().HasKey());
    EXPECT_FALSE(script_list[0].GetChild().HasRedeemScript());
    EXPECT_EQ(script_list[0].GetChild().GetScriptType(), DescriptorScriptType::kDescriptorScriptMiniscript);
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      script_list[0].GetChild().GetLockingScript().ToString().c_str());
  }
}